

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall google::protobuf::Reflection::MaybePoisonAfterClear(Reflection *this,Message *root)

{
  byte bVar1;
  short sVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  MapDynamicFieldInfo<google::protobuf::Message> info;
  undefined8 uVar5;
  CppStringType CVar6;
  int iVar7;
  uint32_t uVar8;
  Reflection *pRVar9;
  Message *pMVar10;
  SooRep *this_00;
  RepeatedPtrIterator<google::protobuf::Message> RVar11;
  RepeatedPtrField<google::protobuf::Message> *pRVar12;
  MapFieldBase *this_01;
  Descriptor *this_02;
  FieldDescriptor *val_f;
  Nonnull<const_char_*> pcVar13;
  bool bVar14;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar15;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_03;
  _lambda_auto_1__1_ *p_Var16;
  long lVar17;
  uint uVar18;
  FieldDescriptor *field;
  long lVar19;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar20;
  ulong uVar21;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar22;
  Metadata MVar23;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_> iVar24
  ;
  iterator iVar25;
  iterator iVar26;
  string_view str;
  string_view str_00;
  bool heap_alloc;
  vector<MemBlock,_std::allocator<MemBlock>_> nodes;
  Descriptor *extendee;
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  queue;
  byte local_189;
  Message *local_188;
  Reflection *local_180;
  RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
  local_178;
  undefined1 local_150 [16];
  Reflection *local_140;
  uint32_t *local_138;
  Reflection *local_130;
  Message *pMStack_128;
  FieldDescriptor *local_120;
  RepeatedPtrField<google::protobuf::Message> *pRStack_118;
  ReflectionSchema *local_110;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  FieldDescriptor *local_f0;
  uint32_t *local_e8;
  ulong local_e0;
  DescriptorPool *local_d8;
  undefined1 local_d0 [8];
  _Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> local_c8;
  MapDynamicFieldInfo<google::protobuf::Message> local_78;
  byte *local_48;
  void **local_40;
  _Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> *local_38;
  
  uVar21 = (root->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar21 & 1) != 0) {
    uVar21 = *(ulong *)(uVar21 & 0xfffffffffffffffe);
  }
  local_189 = uVar21 == 0;
  local_108 = (void *)0x0;
  uStack_100 = 0;
  local_f8 = 0;
  local_140 = (Reflection *)root;
  std::
  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
  ::emplace_back<google::protobuf::Message&>
            ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
              *)&local_108,root);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::
  _M_initialize_map(&local_c8,0);
  local_78.reflection = local_140;
  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
             &local_c8,(Message **)&local_78);
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if ((local_189 & 1) != 0) break;
      pMVar10 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          (_Elt_pointer)
          &((Descriptor *)((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -0xa0))
           ->reserved_range_count_) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             (((Message *)local_c8._M_impl.super__Deque_impl_data._M_start._M_node)->
             super_MessageLite)._internal_metadata_.ptr_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             &((OneofDescriptor *)
              ((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x1f8))->all_names_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             &(((Message *)local_c8._M_impl.super__Deque_impl_data._M_start._M_node)->
              super_MessageLite)._internal_metadata_;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             &((OneofDescriptor *)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur)->
              all_names_;
      }
      local_48 = &local_189;
      local_40 = &local_108;
      local_38 = &local_c8;
      local_150._0_8_ = &local_48;
      local_150._12_4_ = 0x400;
      local_188 = pMVar10;
      MVar23 = Message::GetMetadata(pMVar10);
      pRVar9 = MVar23.reflection;
      if (0 < (pRVar9->schema_).weak_field_map_offset_) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,99,"!schema.HasWeakFields()");
        str_00._M_str = "weak fields are not supported";
        str_00._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_78,str_00);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      if ((pRVar9->schema_).has_bits_offset_ == -1) {
        local_138 = (uint32_t *)0x0;
      }
      else {
        local_138 = GetHasBits(pRVar9,local_188);
      }
      local_110 = &pRVar9->schema_;
      pDVar3 = pRVar9->descriptor_;
      local_e0 = (ulong)pDVar3->field_count_;
      local_180 = pRVar9;
      if (0 < (long)local_e0) {
        local_e8 = (pRVar9->schema_).has_bit_indices_;
        uVar21 = 0;
        do {
          if ((long)pDVar3->field_count_ <= (long)uVar21) {
            pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (uVar21 & 0xffffffff,(long)pDVar3->field_count_,
                                 "index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar13);
LAB_00414c21:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_178);
          }
          if (((pDVar3->fields_[uVar21].options_)->field_0)._impl_.weak_ == true) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x6e,"!field->options().weak()");
            str._M_str = "weak fields are not supported";
            str._M_len = 0x1d;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)&local_178,str);
            goto LAB_00414c21;
          }
          field = pDVar3->fields_ + uVar21;
          if ((local_150._12_4_ != 0xffffffff) &&
             (((uint)local_150._12_4_ >>
               (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) & 0x1f) & 1)
              == 0)) goto LAB_00414780;
          bVar1 = field->field_0x1;
          bVar14 = (bool)((bVar1 & 0x20) >> 5);
          if (0xbf < bVar1 != bVar14) {
            pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar14,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar13);
            goto LAB_00414c21;
          }
          if ((bVar1 & 0x20) == 0) {
            bVar14 = internal::ReflectionSchema::InRealOneof(local_110,field);
            p_Var16 = (_lambda_auto_1__1_ *)local_150._0_8_;
            if (bVar14) {
              pOVar4 = (field->scope_).containing_oneof;
              if (pOVar4 == (OneofDescriptor *)0x0) {
                internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
              if ((ulong)*(uint *)((long)&(local_188->super_MessageLite)._vptr_MessageLite +
                                  (long)((int)((ulong)((long)pOVar4 -
                                                      (long)pOVar4->containing_type_->oneof_decls_)
                                              >> 3) * -0x49249249) * 4 +
                                  (ulong)(uint)(local_180->schema_).oneof_case_offset_) !=
                  (long)field->number_) goto LAB_00414780;
              bVar1 = field->type_;
              iVar7 = 0xf6;
              if (0x12 < bVar1) goto LAB_00414bef;
              if ((0x7e1feU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00414780;
              iVar7 = 0xf6;
              if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_0041452d:
                if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_00414bef:
                  internal::Unreachable
                            ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                             ,iVar7);
                }
                FieldDescriptor::cpp_string_type(field);
              }
              else {
                pRVar9 = (Reflection *)
                         MutableMessage(local_180,local_188,field,(MessageFactory *)0x0);
                pMVar10 = (pRVar9->schema_).default_instance_;
                if (((ulong)pMVar10 & 1) != 0) {
                  pMVar10 = *(Message **)((ulong)pMVar10 & 0xfffffffffffffffe);
                }
                if (pMVar10 != (Message *)0x0) {
                  std::
                  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                  ::emplace_back<google::protobuf::Message&>
                            (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                               **)(p_Var16 + 8),(Message *)pRVar9);
                  local_178.reflection = pRVar9;
                  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                  ::emplace_back<google::protobuf::Message*>
                            (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                               **)(p_Var16 + 0x10),(Message **)&local_178);
                  goto LAB_00414780;
                }
LAB_004147e6:
                **(byte **)p_Var16 = 1;
              }
            }
            else if ((local_138 == (uint32_t *)0x0) ||
                    (uVar18 = local_e8[uVar21], uVar18 == 0xffffffff)) {
              bVar14 = HasFieldSingular(local_180,local_188,field);
              if (bVar14) goto LAB_004144fe;
            }
            else if ((local_138[uVar18 >> 5] >> (uVar18 & 0x1f) & 1) != 0) {
LAB_004144fe:
              p_Var16 = (_lambda_auto_1__1_ *)local_150._0_8_;
              bVar1 = field->type_;
              iVar7 = 0x12d;
              if (0x12 < bVar1) goto LAB_00414bef;
              if ((0x7e1feU >> (bVar1 & 0x1f) & 1) == 0) {
                iVar7 = 0x12d;
                if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0041452d;
                pRVar9 = (Reflection *)
                         MutableMessage(local_180,local_188,field,(MessageFactory *)0x0);
                pMVar10 = (pRVar9->schema_).default_instance_;
                if (((ulong)pMVar10 & 1) != 0) {
                  pMVar10 = *(Message **)((ulong)pMVar10 & 0xfffffffffffffffe);
                }
                if (pMVar10 == (Message *)0x0) goto LAB_004147e6;
                std::
                vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                ::emplace_back<google::protobuf::Message&>
                          (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                             **)(p_Var16 + 8),(Message *)pRVar9);
                local_178.reflection = pRVar9;
                std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
                emplace_back<google::protobuf::Message*>
                          (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                             **)(p_Var16 + 0x10),(Message **)&local_178);
              }
            }
            goto LAB_00414780;
          }
          switch(field->type_) {
          case '\x01':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<double>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\x02':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<float>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\x03':
          case '\x10':
          case '\x12':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\x04':
          case '\x06':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\x05':
          case '\x0e':
          case '\x0f':
          case '\x11':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\a':
          case '\r':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\b':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                                 (local_180,local_188,field)->soo_rep_;
            break;
          case '\t':
          case '\f':
            CVar6 = FieldDescriptor::cpp_string_type(field);
            if (CVar6 - kView < 3) {
              GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (local_180,local_188,field);
            }
            goto LAB_00414780;
          case '\n':
            pRVar12 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                (local_180,local_188,field);
            if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) {
              local_178.reflection = local_180;
              local_178.message = local_188;
              local_178.field = field;
              local_178.const_repeated = pRVar12;
              iVar24 = internal::
                       RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                       ::Mutable(&local_178);
              uVar5 = local_150._0_8_;
              for (RVar11 = iVar24.begin_iterator_.it_; RVar11.it_ != iVar24.end_iterator_.it_.it_;
                  RVar11.it_ = RVar11.it_ + 1) {
                pRVar9 = (Reflection *)
                         DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
                pMVar10 = (pRVar9->schema_).default_instance_;
                if (((ulong)pMVar10 & 1) != 0) {
                  pMVar10 = *(Message **)((ulong)pMVar10 & 0xfffffffffffffffe);
                }
                if (pMVar10 == (Message *)0x0) {
                  **(byte **)uVar5 = 1;
                }
                else {
                  std::
                  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                  ::emplace_back<google::protobuf::Message&>
                            (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                               **)(uVar5 + 8),(Message *)pRVar9);
                  local_130 = pRVar9;
                  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                  ::emplace_back<google::protobuf::Message*>
                            (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                               **)(uVar5 + 0x10),(Message **)&local_130);
                }
              }
            }
            goto LAB_00414780;
          case '\v':
            bVar14 = FieldDescriptor::is_map_message_type(field);
            if (bVar14) {
              this_01 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                                  (local_180,local_188,field);
              iVar7 = internal::MapFieldBase::size(this_01);
              if (iVar7 != 0) {
                this_02 = FieldDescriptor::message_type(field);
                local_f0 = Descriptor::map_key(this_02);
                val_f = Descriptor::map_value(this_02);
                internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                          (&local_78,local_180,local_188,field,local_f0,val_f,this_01);
                info.message._0_4_ = (int)local_78.message;
                info.reflection = local_78.reflection;
                info.message._4_4_ = (int)((ulong)local_78.message >> 0x20);
                info.field._0_4_ = (int)local_78.field;
                info.field._4_4_ = (int)((ulong)local_78.field >> 0x20);
                info.key._0_4_ = (int)local_78.key;
                info.key._4_4_ = (int)((ulong)local_78.key >> 0x20);
                info.value = local_78.value;
                info.const_map_field = local_78.const_map_field;
                internal::ReflectionVisit::
                VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)
                ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)local_150._0_8_,info);
              }
            }
            else {
              pRVar12 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                  (local_180,local_188,field);
              if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) {
                local_178.reflection = local_180;
                local_178.message = local_188;
                local_178.field = field;
                local_178.const_repeated = pRVar12;
                iVar24 = internal::
                         RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                         ::Mutable(&local_178);
                uVar5 = local_150._0_8_;
                for (RVar11 = iVar24.begin_iterator_.it_; RVar11.it_ != iVar24.end_iterator_.it_.it_
                    ; RVar11.it_ = RVar11.it_ + 1) {
                  pRVar9 = (Reflection *)
                           DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
                  pMVar10 = (pRVar9->schema_).default_instance_;
                  if (((ulong)pMVar10 & 1) != 0) {
                    pMVar10 = *(Message **)((ulong)pMVar10 & 0xfffffffffffffffe);
                  }
                  if (pMVar10 == (Message *)0x0) {
                    **(byte **)uVar5 = 1;
                  }
                  else {
                    std::
                    vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                    ::emplace_back<google::protobuf::Message&>
                              (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                                 **)(uVar5 + 8),(Message *)pRVar9);
                    local_130 = pRVar9;
                    std::
                    deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
                    emplace_back<google::protobuf::Message*>
                              (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                                 **)(uVar5 + 0x10),(Message **)&local_130);
                  }
                }
              }
            }
            goto LAB_00414780;
          default:
            iVar7 = 0xbb;
            goto LAB_00414bef;
          }
          internal::SooRep::size
                    (this_00,(undefined1  [16])
                             ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
LAB_00414780:
          uVar21 = uVar21 + 1;
        } while (uVar21 != local_e0);
      }
      pRVar9 = local_180;
      if ((local_180->schema_).extensions_offset_ != -1) {
        uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(local_110);
        uVar21 = (ulong)uVar8;
        local_d0 = (undefined1  [8])((MessageLite *)&pRVar9->descriptor_)->_vptr_MessageLite;
        local_d8 = pRVar9->descriptor_pool_;
        local_130 = (Reflection *)(local_150 + 0xc);
        pMStack_128 = (Message *)local_150;
        local_120 = (FieldDescriptor *)&local_d8;
        pRStack_118 = (RepeatedPtrField<google::protobuf::Message> *)local_d0;
        sVar2 = *(short *)((long)&(local_188->super_MessageLite)._internal_metadata_.ptr_ +
                          uVar21 + 2);
        this_03 = *(btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    **)((long)&local_188[1].super_MessageLite._vptr_MessageLite + uVar21);
        if ((long)sVar2 < 0) {
          iVar25 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   ::begin(this_03);
          iVar26 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   ::end(*(btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                           **)((long)&local_188[1].super_MessageLite._vptr_MessageLite + uVar21));
          internal::ExtensionSet::
          ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ReflectionVisit::VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&&)::_lambda(auto:1)_1_>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&&)::_lambda(auto:1)_1_&&,google::protobuf::internal::FieldMask)::_lambda(int,auto:1&)_1_,google::protobuf::internal::ExtensionSet::Prefetch>
                    (iVar25.node_,iVar25.position_,iVar26.node_,iVar26._8_8_ & 0xffffffff);
        }
        else {
          lVar19 = (long)sVar2 * 0x20;
          pbVar22 = this_03;
          local_178.reflection = local_130;
          local_178.message = pMStack_128;
          local_178.field = local_120;
          local_178.const_repeated = pRStack_118;
          if (sVar2 != 0) {
            lVar17 = lVar19;
            uVar18 = 0;
            do {
              lVar17 = lVar17 + -0x20;
              internal::ExtensionSet::Extension::PrefetchPtr((Extension *)&pbVar22->rightmost_);
              pbVar22 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)&pbVar22[1].rightmost_;
              if (lVar17 == 0) break;
              bVar14 = uVar18 < 0xf;
              uVar18 = uVar18 + 1;
            } while (bVar14);
          }
          pbVar20 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)(lVar19 + (long)this_03);
          if (pbVar22 != pbVar20) {
            do {
              pbVar15 = this_03;
              internal::ReflectionVisit::
              VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
              ::{lambda(int,auto:1&)#1}::operator()
                        (&local_178,*(int *)&pbVar15->root_,(Extension *)&pbVar15->rightmost_);
              internal::ExtensionSet::Extension::PrefetchPtr((Extension *)&pbVar22->rightmost_);
              pbVar22 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)&pbVar22[1].rightmost_;
              this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)&pbVar15[1].rightmost_;
            } while (pbVar22 != pbVar20);
            this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)&pbVar15[1].rightmost_;
          }
          for (; this_03 != pbVar20;
              this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)&this_03[1].rightmost_) {
            internal::ReflectionVisit::
            VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()
                      (&local_178,*(int *)&this_03->root_,(Extension *)&this_03->rightmost_);
          }
        }
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  (*((MessageLite *)&local_140->descriptor_)->_vptr_MessageLite[2])();
  std::_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::
  ~_Deque_base(&local_c8);
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return;
}

Assistant:

void Reflection::MaybePoisonAfterClear(Message& root) const {
  struct MemBlock {
    explicit MemBlock(Message& msg)
        : ptr(static_cast<void*>(&msg)), size(GetSize(msg)) {}

    static uint32_t GetSize(const Message& msg) {
      return msg.GetReflection()->schema_.GetObjectSize();
    }

    void* ptr;
    uint32_t size;
  };

  bool heap_alloc = root.GetArena() == nullptr;
  std::vector<MemBlock> nodes;

#ifdef __cpp_if_constexpr
  nodes.emplace_back(root);

  std::queue<Message*> queue;
  queue.push(&root);

  while (!queue.empty() && !heap_alloc) {
    Message* curr = queue.front();
    queue.pop();
    internal::VisitMutableMessageFields(*curr, [&](Message& msg) {
      if (msg.GetArena() == nullptr) {
        heap_alloc = true;
        return;
      }

      nodes.emplace_back(msg);
      // Also visits child messages.
      queue.push(&msg);
    });
  }
#endif

  root.Clear();

  // Heap allocated oneof messages will be freed on clear. So, poisoning
  // afterwards may cause use-after-free. Bailout.
  if (heap_alloc) return;

  for (auto it : nodes) {
    (void)it;
    internal::PoisonMemoryRegion(it.ptr, it.size);
  }
}